

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ini.hpp
# Opt level: O2

vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *
CLI::detail::parse_ini
          (vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
           *__return_storage_ptr__,istream *input)

{
  pointer piVar1;
  char cVar2;
  bool bVar3;
  istream *piVar4;
  long lVar5;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string name;
  string local_d0;
  string section;
  string item;
  string local_70;
  string local_50;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&section,"default",(allocator *)&item);
  (__return_storage_ptr__->
  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    piVar4 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>(input,(string *)&line)
    ;
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      ::std::__cxx11::string::~string((string *)&section);
      ::std::__cxx11::string::~string((string *)&line);
      ::std::__cxx11::string::~string((string *)&name);
      return __return_storage_ptr__;
    }
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    trim(&line);
    if (line._M_string_length < 2) {
      if (line._M_string_length != 0) {
        cVar2 = *line._M_dataplus._M_p;
        goto LAB_0010cfb2;
      }
    }
    else {
      cVar2 = *line._M_dataplus._M_p;
      if (cVar2 == '[') {
        if (line._M_dataplus._M_p[line._M_string_length - 1] == ']') {
          ::std::__cxx11::string::substr((ulong)&item,(ulong)&line);
          ::std::__cxx11::string::operator=((string *)&section,(string *)&item);
          ::std::__cxx11::string::~string((string *)&item);
          goto LAB_0010d1a5;
        }
      }
      else {
LAB_0010cfb2:
        if (cVar2 == ';') goto LAB_0010d1a5;
      }
      std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::emplace_back<>
                (__return_storage_ptr__);
      piVar1 = (__return_storage_ptr__->
               super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      lVar5 = ::std::__cxx11::string::find((char *)&line,0x111327);
      if (lVar5 == -1) {
        trim_copy(&item,&line);
        ::std::__cxx11::string::operator=((string *)&name,(string *)&item);
        ::std::__cxx11::string::~string((string *)&item);
        ::std::__cxx11::string::string((string *)&item,"ON",(allocator *)&local_d0);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&items,&item
                   ,&local_70);
      }
      else {
        ::std::__cxx11::string::substr((ulong)&local_d0,(ulong)&line);
        trim_copy(&item,&local_d0);
        ::std::__cxx11::string::operator=((string *)&name,(string *)&item);
        ::std::__cxx11::string::~string((string *)&item);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::substr((ulong)&local_d0,(ulong)&line);
        trim_copy(&item,&local_d0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::string((string *)&local_50,(string *)&item);
        split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_d0,&local_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&items,&local_d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
      ::std::__cxx11::string::~string((string *)&item);
      ::std::__cxx11::string::string((string *)&local_70,(string *)&section);
      to_lower(&item,&local_70);
      bVar3 = ::std::operator==(&item,"default");
      ::std::__cxx11::string::~string((string *)&item);
      ::std::__cxx11::string::~string((string *)&local_70);
      if (bVar3) {
        ::std::__cxx11::string::_M_assign((string *)(piVar1 + -1));
      }
      else {
        ::std::operator+(&local_d0,&section,".");
        ::std::operator+(&item,&local_d0,&name);
        ::std::__cxx11::string::operator=((string *)(piVar1 + -1),(string *)&item);
        ::std::__cxx11::string::~string((string *)&item);
        ::std::__cxx11::string::~string((string *)&local_d0);
      }
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &piVar1[-1].inputs,
                 piVar1[-1].inputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )items.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )items.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    }
LAB_0010d1a5:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&items);
  } while( true );
}

Assistant:

inline std::vector<ini_ret_t> parse_ini(std::istream &input) {
    std::string name, line;
    std::string section = "default";

    std::vector<ini_ret_t> output;

    while(getline(input, line)) {
        std::vector<std::string> items;

        detail::trim(line);
        size_t len = line.length();
        if(len > 1 && line[0] == '[' && line[len - 1] == ']') {
            section = line.substr(1, len - 2);
        } else if(len > 0 && line[0] != ';') {
            output.emplace_back();
            ini_ret_t &out = output.back();

            // Find = in string, split and recombine
            auto pos = line.find("=");
            if(pos != std::string::npos) {
                name = detail::trim_copy(line.substr(0, pos));
                std::string item = detail::trim_copy(line.substr(pos + 1));
                items = detail::split_up(item);
            } else {
                name = detail::trim_copy(line);
                items = {"ON"};
            }

            if(detail::to_lower(section) == "default")
                out.fullname = name;
            else
                out.fullname = section + "." + name;

            out.inputs.insert(std::end(out.inputs), std::begin(items), std::end(items));
        }
    }
    return output;
}